

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O2

void __thiscall
Kandinsky::VariableExpression::fillVariableSet
          (VariableExpression *this,
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *variableSet,BaseExpressionPtr *thisSharedPtr)

{
  shared_ptr<Kandinsky::BaseExpression> local_40;
  Variable local_30;
  
  std::dynamic_pointer_cast<Kandinsky::VariableExpression,Kandinsky::BaseExpression>(&local_40);
  Variable::Variable(&local_30,(VariableExpressionPtr *)&local_40);
  std::
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::_M_insert_unique<Kandinsky::Variable>(&variableSet->_M_t,&local_30);
  Variable::~Variable(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void VariableExpression::fillVariableSet(std::set<Variable, VariableLessThanComparator>& variableSet, const BaseExpressionPtr& thisSharedPtr) const
    {
        variableSet.insert(Variable(std::dynamic_pointer_cast<VariableExpression>(thisSharedPtr)));
    }